

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkStarting(XmlReporter *this,BenchmarkInfo *info)

{
  XmlFormatting fmt;
  XmlWriter *pXVar1;
  StringRef SVar2;
  BenchmarkInfo *info_local;
  XmlReporter *this_local;
  
  SVar2 = operator____sr("samples",7);
  pXVar1 = XmlWriter::writeAttribute<unsigned_int,void>(&this->m_xml,SVar2,&info->samples);
  SVar2 = operator____sr("resamples",9);
  pXVar1 = XmlWriter::writeAttribute<unsigned_int,void>(pXVar1,SVar2,&info->resamples);
  SVar2 = operator____sr("iterations",10);
  pXVar1 = XmlWriter::writeAttribute<int,void>(pXVar1,SVar2,&info->iterations);
  SVar2 = operator____sr("clockResolution",0xf);
  pXVar1 = XmlWriter::writeAttribute<double,void>(pXVar1,SVar2,&info->clockResolution);
  SVar2 = operator____sr("estimatedDuration",0x11);
  pXVar1 = XmlWriter::writeAttribute<double,void>(pXVar1,SVar2,&info->estimatedDuration);
  SVar2 = operator____sr("All values in nano seconds",0x1a);
  fmt = operator|(Newline,Indent);
  XmlWriter::writeComment(pXVar1,SVar2,fmt);
  return;
}

Assistant:

void XmlReporter::benchmarkStarting(BenchmarkInfo const &info) {
        m_xml.writeAttribute("samples"_sr, info.samples)
            .writeAttribute("resamples"_sr, info.resamples)
            .writeAttribute("iterations"_sr, info.iterations)
            .writeAttribute("clockResolution"_sr, info.clockResolution)
            .writeAttribute("estimatedDuration"_sr, info.estimatedDuration)
            .writeComment("All values in nano seconds"_sr);
    }